

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testRunStarting(XmlReporter *this,TestRunInfo *testInfo)

{
  byte bVar1;
  IConfig *pIVar2;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  string local_70 [55];
  allocator<char> local_39;
  string local_38;
  TestRunInfo *local_18;
  TestRunInfo *testInfo_local;
  XmlReporter *this_local;
  
  local_18 = testInfo;
  testInfo_local = (TestRunInfo *)this;
  StreamingReporterBase::testRunStarting(&this->super_StreamingReporterBase,testInfo);
  XmlWriter::setStream(&this->m_xml,(this->super_StreamingReporterBase).stream);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Catch",&local_39);
  XmlWriter::startElement(&this->m_xml,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pIVar2 = Ptr<const_Catch::IConfig>::operator->(&(this->super_StreamingReporterBase).m_config);
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(local_70);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string(local_70);
  if (((bVar1 ^ 0xff) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"name",&local_91);
    pIVar2 = Ptr<const_Catch::IConfig>::operator->(&(this->super_StreamingReporterBase).m_config);
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(&local_b8);
    XmlWriter::writeAttribute(&this->m_xml,&local_90,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
  }
  return;
}

Assistant:

virtual void testRunStarting( TestRunInfo const& testInfo ) CATCH_OVERRIDE {
            StreamingReporterBase::testRunStarting( testInfo );
            m_xml.setStream( stream );
            m_xml.startElement( "Catch" );
            if( !m_config->name().empty() )
                m_xml.writeAttribute( "name", m_config->name() );
        }